

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O1

SearchResult *
search::search(SearchResult *__return_storage_ptr__,Position *pos,SearchGlobals *sg,int depth)

{
  undefined1 *puVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  array<search::SearchStack,_128UL> search_stack;
  SearchStack local_a28 [128];
  
  puVar1 = &stack0xfffffffffffff5c8;
  lVar4 = 0;
  memset(local_a28,0,0xa00);
  do {
    puVar1 = puVar1 + 0x14;
    lVar3 = 0;
    do {
      puVar1[lVar3] = 0;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x10);
    lVar4 = lVar4 + 0x14;
  } while (lVar4 != 0xa00);
  piVar2 = &local_a28[0].ply;
  lVar4 = 0;
  do {
    *piVar2 = (int)lVar4;
    *(bool *)(piVar2 + -3) = false;
    *(bool *)(piVar2 + -1) = false;
    lVar4 = lVar4 + 1;
    piVar2 = piVar2 + 5;
  } while (lVar4 != 0x80);
  search_impl(__return_storage_ptr__,pos,-0x7531,0x7531,depth,local_a28,sg);
  return __return_storage_ptr__;
}

Assistant:

SearchResult search(Position& pos, SearchGlobals& sg, int depth) {
    auto search_stack = SearchStack::new_search_stack();
    int alpha = -INFINITE;
    int beta = +INFINITE;
    SearchResult search_result = search_impl(pos, alpha, beta, depth, search_stack.begin(), sg);
    return search_result;
}